

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O3

QDebug operator<<(QDebug dbg,QDockAreaLayoutItem *item)

{
  Data *pDVar1;
  QDebug QVar2;
  long lVar3;
  long *in_RDX;
  QLayoutItem *pQVar4;
  QDebug *this;
  Stream *__old_val;
  long in_FS_OFFSET;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QByteArrayView QVar18;
  QByteArrayView QVar19;
  QList<QDockWidget_*> list;
  QDebugStateSaver saver;
  QDebug local_a8;
  undefined1 local_a0 [8];
  QList<QDockWidget_*> local_98;
  undefined1 local_80 [8];
  QDebug local_78;
  QDebug local_70;
  QDebug local_68;
  undefined1 local_60 [8];
  undefined1 *local_58;
  QArrayData *local_50 [3];
  long local_38;
  
  this = &local_a8;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_58,(QDebug *)item);
  pQVar4 = item->widgetItem;
  *(undefined1 *)&pQVar4[3]._vptr_QLayoutItem = 0;
  QVar5.m_data = (storage_type *)0x14;
  QVar5.m_size = (qsizetype)local_50;
  QString::fromUtf8(QVar5);
  QTextStream::operator<<((QTextStream *)pQVar4,(QString *)local_50);
  if (local_50[0] != (QArrayData *)0x0) {
    LOCK();
    (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_50[0],2,0x10);
    }
  }
  pQVar4 = item->widgetItem;
  if (*(char *)&pQVar4[3]._vptr_QLayoutItem == '\x01') {
    QTextStream::operator<<((QTextStream *)pQVar4,' ');
    pQVar4 = item->widgetItem;
  }
  QTextStream::operator<<((QTextStream *)pQVar4,in_RDX);
  pQVar4 = item->widgetItem;
  if (*(char *)&pQVar4[3]._vptr_QLayoutItem == '\x01') {
    QTextStream::operator<<((QTextStream *)pQVar4,' ');
    pQVar4 = item->widgetItem;
  }
  QVar6.m_data = (storage_type *)0x2;
  QVar6.m_size = (qsizetype)local_50;
  QString::fromUtf8(QVar6);
  QTextStream::operator<<((QTextStream *)pQVar4,(QString *)local_50);
  if (local_50[0] != (QArrayData *)0x0) {
    LOCK();
    (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_50[0],2,0x10);
    }
  }
  if (*(char *)&item->widgetItem[3]._vptr_QLayoutItem == '\x01') {
    QTextStream::operator<<((QTextStream *)item->widgetItem,' ');
  }
  if ((long *)*in_RDX == (long *)0x0) {
    if (in_RDX[1] == 0) {
      if (in_RDX[2] != 0) {
        pQVar4 = item->widgetItem;
        QVar15.m_data = (storage_type *)0x10;
        QVar15.m_size = (qsizetype)local_50;
        QString::fromUtf8(QVar15);
        QTextStream::operator<<((QTextStream *)pQVar4,(QString *)local_50);
        if (local_50[0] != (QArrayData *)0x0) {
          LOCK();
          (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_50[0],2,0x10);
          }
        }
        pQVar4 = item->widgetItem;
        if (*(char *)&pQVar4[3]._vptr_QLayoutItem == '\x01') {
          QTextStream::operator<<((QTextStream *)pQVar4,' ');
          pQVar4 = item->widgetItem;
        }
        QTextStream::operator<<((QTextStream *)pQVar4,(void *)in_RDX[2]);
        pQVar4 = item->widgetItem;
        if (*(char *)&pQVar4[3]._vptr_QLayoutItem == '\x01') {
          QTextStream::operator<<((QTextStream *)pQVar4,' ');
          pQVar4 = item->widgetItem;
        }
        QVar16.m_data = (storage_type *)0x1;
        QVar16.m_size = (qsizetype)local_50;
        QString::fromUtf8(QVar16);
        QTextStream::operator<<((QTextStream *)pQVar4,(QString *)local_50);
        if (local_50[0] != (QArrayData *)0x0) {
          LOCK();
          (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_50[0],2,0x10);
          }
        }
        if (*(char *)&item->widgetItem[3]._vptr_QLayoutItem == '\x01') {
          QTextStream::operator<<((QTextStream *)item->widgetItem,' ');
        }
      }
      goto LAB_003ee969;
    }
    pQVar4 = item->widgetItem;
    QVar9.m_data = (storage_type *)0x8;
    QVar9.m_size = (qsizetype)local_50;
    QString::fromUtf8(QVar9);
    QTextStream::operator<<((QTextStream *)pQVar4,(QString *)local_50);
    if (local_50[0] != (QArrayData *)0x0) {
      LOCK();
      (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_50[0],2,0x10);
      }
    }
    pQVar4 = item->widgetItem;
    if (*(char *)&pQVar4[3]._vptr_QLayoutItem == '\x01') {
      QTextStream::operator<<((QTextStream *)pQVar4,' ');
      pQVar4 = item->widgetItem;
    }
    QTextStream::operator<<((QTextStream *)pQVar4,(void *)in_RDX[1]);
    pQVar4 = item->widgetItem;
    if (*(char *)&pQVar4[3]._vptr_QLayoutItem == '\x01') {
      QTextStream::operator<<((QTextStream *)pQVar4,' ');
      pQVar4 = item->widgetItem;
    }
    QVar10.m_data = (storage_type *)0x3;
    QVar10.m_size = (qsizetype)local_50;
    QString::fromUtf8(QVar10);
    QTextStream::operator<<((QTextStream *)pQVar4,(QString *)local_50);
    if (local_50[0] != (QArrayData *)0x0) {
      LOCK();
      (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_50[0],2,0x10);
      }
    }
    local_50[0] = (QArrayData *)item->widgetItem;
    if (*(char *)&local_50[0][3].ref_._q_value.super___atomic_base<int>._M_i == '\x01') {
      QTextStream::operator<<((QTextStream *)local_50[0],' ');
      local_50[0] = (QArrayData *)item->widgetItem;
    }
    (((Alignment *)&local_50[0][2].alloc)->super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>).
    super_QFlagsStorage<Qt::AlignmentFlag>.i =
         (((Alignment *)&local_50[0][2].alloc)->super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>).
         super_QFlagsStorage<Qt::AlignmentFlag>.i + 1;
    local_a8.stream = (Stream *)0x0;
    QtPrivate::printSequentialContainer<QList<QDockAreaLayoutItem>>
              ((QtPrivate *)&local_98,(Stream *)local_50,"QList",
               (QList<QDockAreaLayoutItem> *)(in_RDX[1] + 0x40));
    QDebug::~QDebug((QDebug *)local_50);
    pDVar1 = local_98.d.d;
    QVar11.m_data = (storage_type *)0x1;
    QVar11.m_size = (qsizetype)local_50;
    QString::fromUtf8(QVar11);
    QTextStream::operator<<((QTextStream *)pDVar1,(QString *)local_50);
    if (local_50[0] != (QArrayData *)0x0) {
      LOCK();
      (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_50[0],2,0x10);
      }
    }
    if ((char)local_98.d.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i == '\x01'
       ) {
      QTextStream::operator<<((QTextStream *)local_98.d.d,' ');
    }
    QDebug::~QDebug((QDebug *)&local_98);
  }
  else {
    (**(code **)(*(long *)*in_RDX + 0x68))();
    lVar3 = QMetaObject::cast((QObject *)&QDockWidget::staticMetaObject);
    if (lVar3 == 0) {
      lVar3 = QMetaObject::cast((QObject *)&QDockWidgetGroupWindow::staticMetaObject);
      if (lVar3 == 0) {
        pQVar4 = item->widgetItem;
        QVar17.m_data = &DAT_0000000b;
        QVar17.m_size = (qsizetype)local_50;
        QString::fromUtf8(QVar17);
        QTextStream::operator<<((QTextStream *)pQVar4,(QString *)local_50);
        if (local_50[0] != (QArrayData *)0x0) {
          LOCK();
          (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_50[0],2,0x10);
          }
        }
        local_a0 = (undefined1  [8])item->widgetItem;
        if (*(char *)&((QLayoutItem *)((long)local_a0 + 0x30))->_vptr_QLayoutItem == '\x01') {
          QTextStream::operator<<((QTextStream *)local_a0,' ');
          local_a0 = (undefined1  [8])item->widgetItem;
        }
        (((QLayoutItem *)((long)local_a0 + 0x20))->align).
        super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.super_QFlagsStorage<Qt::AlignmentFlag>.i =
             (((QLayoutItem *)((long)local_a0 + 0x20))->align).
             super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.super_QFlagsStorage<Qt::AlignmentFlag>.
             i + 1;
        operator<<((Stream *)&local_98,(QWidget *)local_a0);
        pDVar1 = local_98.d.d;
        QVar18.m_data = (storage_type *)0x1;
        QVar18.m_size = (qsizetype)local_50;
        QString::fromUtf8(QVar18);
        QTextStream::operator<<((QTextStream *)pDVar1,(QString *)local_50);
        if (local_50[0] != (QArrayData *)0x0) {
          LOCK();
          (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_50[0],2,0x10);
          }
        }
        if ((char)local_98.d.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i ==
            '\x01') {
          QTextStream::operator<<((QTextStream *)local_98.d.d,' ');
        }
        QDebug::~QDebug((QDebug *)&local_98);
        this = (QDebug *)local_a0;
      }
      else {
        pQVar4 = item->widgetItem;
        QVar12.m_data = &DAT_0000000b;
        QVar12.m_size = (qsizetype)local_50;
        QString::fromUtf8(QVar12);
        QTextStream::operator<<((QTextStream *)pQVar4,(QString *)local_50);
        if (local_50[0] != (QArrayData *)0x0) {
          LOCK();
          (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_50[0],2,0x10);
          }
        }
        local_80 = (undefined1  [8])item->widgetItem;
        if (*(char *)&((QLayoutItem *)((long)local_80 + 0x30))->_vptr_QLayoutItem == '\x01') {
          QTextStream::operator<<((QTextStream *)local_80,' ');
          local_80 = (undefined1  [8])item->widgetItem;
        }
        (((QLayoutItem *)((long)local_80 + 0x20))->align).
        super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.super_QFlagsStorage<Qt::AlignmentFlag>.i =
             (((QLayoutItem *)((long)local_80 + 0x20))->align).
             super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.super_QFlagsStorage<Qt::AlignmentFlag>.
             i + 1;
        operator<<((Stream *)&local_78,(QWidget *)local_80);
        QVar2.stream = local_78.stream;
        QVar13.m_data = (storage_type *)0x3;
        QVar13.m_size = (qsizetype)local_50;
        QString::fromUtf8(QVar13);
        QTextStream::operator<<((QTextStream *)QVar2.stream,(QString *)local_50);
        if (local_50[0] != (QArrayData *)0x0) {
          LOCK();
          (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_50[0],2,0x10);
          }
        }
        local_50[0] = (QArrayData *)local_78.stream;
        if ((char)(((QArrayData *)(local_78.stream + 0x30))->ref_)._q_value.super___atomic_base<int>
                  ._M_i == '\x01') {
          QTextStream::operator<<((QTextStream *)local_78.stream,' ');
          local_50[0] = (QArrayData *)local_78.stream;
        }
        *(int *)&local_50[0][2].alloc = (int)local_50[0][2].alloc + 1;
        local_98.d.size = 0;
        local_98.d.d = (Data *)0x0;
        local_98.d.ptr = (QDockWidget **)0x0;
        qt_qFindChildren_helper(lVar3,0,0,&QDockWidget::staticMetaObject,&local_98,1);
        local_70.stream = (Stream *)0x0;
        QtPrivate::printSequentialContainer<QList<QDockWidget*>>
                  ((QtPrivate *)&local_68,(Stream *)local_50,"QList",&local_98);
        QDebug::~QDebug((QDebug *)local_50);
        QVar2.stream = local_68.stream;
        QVar14.m_data = (storage_type *)0x2;
        QVar14.m_size = (qsizetype)local_50;
        QString::fromUtf8(QVar14);
        QTextStream::operator<<((QTextStream *)QVar2.stream,(QString *)local_50);
        if (local_50[0] != (QArrayData *)0x0) {
          LOCK();
          (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_50[0],2,0x10);
          }
        }
        if (*(QTextStream *)(local_68.stream + 0x30) == (QTextStream)0x1) {
          QTextStream::operator<<((QTextStream *)local_68.stream,' ');
        }
        QDebug::~QDebug(&local_68);
        if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,8,0x10);
          }
        }
        QDebug::~QDebug(&local_70);
        QDebug::~QDebug(&local_78);
        this = (QDebug *)local_80;
      }
    }
    else {
      pQVar4 = item->widgetItem;
      QVar7.m_data = &DAT_0000000b;
      QVar7.m_size = (qsizetype)local_50;
      QString::fromUtf8(QVar7);
      QTextStream::operator<<((QTextStream *)pQVar4,(QString *)local_50);
      if (local_50[0] != (QArrayData *)0x0) {
        LOCK();
        (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_50[0],2,0x10);
        }
      }
      local_60 = (undefined1  [8])item->widgetItem;
      if (*(char *)&((QLayoutItem *)((long)local_60 + 0x30))->_vptr_QLayoutItem == '\x01') {
        QTextStream::operator<<((QTextStream *)local_60,' ');
        local_60 = (undefined1  [8])item->widgetItem;
      }
      (((QLayoutItem *)((long)local_60 + 0x20))->align).
      super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.super_QFlagsStorage<Qt::AlignmentFlag>.i =
           (((QLayoutItem *)((long)local_60 + 0x20))->align).
           super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.super_QFlagsStorage<Qt::AlignmentFlag>.i
           + 1;
      operator<<((Stream *)&local_98,(QDockWidget *)local_60);
      pDVar1 = local_98.d.d;
      QVar8.m_data = (storage_type *)0x1;
      QVar8.m_size = (qsizetype)local_50;
      QString::fromUtf8(QVar8);
      QTextStream::operator<<((QTextStream *)pDVar1,(QString *)local_50);
      if (local_50[0] != (QArrayData *)0x0) {
        LOCK();
        (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_50[0],2,0x10);
        }
      }
      if ((char)local_98.d.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i ==
          '\x01') {
        QTextStream::operator<<((QTextStream *)local_98.d.d,' ');
      }
      QDebug::~QDebug((QDebug *)&local_98);
      this = (QDebug *)local_60;
    }
  }
  QDebug::~QDebug(this);
LAB_003ee969:
  pQVar4 = item->widgetItem;
  QVar19.m_data = (storage_type *)0x1;
  QVar19.m_size = (qsizetype)local_50;
  QString::fromUtf8(QVar19);
  QTextStream::operator<<((QTextStream *)pQVar4,(QString *)local_50);
  if (local_50[0] != (QArrayData *)0x0) {
    LOCK();
    (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_50[0],2,0x10);
    }
  }
  pQVar4 = item->widgetItem;
  if (*(char *)&pQVar4[3]._vptr_QLayoutItem == '\x01') {
    QTextStream::operator<<((QTextStream *)pQVar4,' ');
    pQVar4 = item->widgetItem;
  }
  item->widgetItem = (QLayoutItem *)0x0;
  *(QLayoutItem **)dbg.stream = pQVar4;
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QDebug)dbg.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QDockAreaLayoutItem &item)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace();
    dbg << "QDockAreaLayoutItem(" << static_cast<const void *>(&item) << "->";
    if (item.widgetItem) {
        QWidget *widget = item.widgetItem->widget();
        if (auto *dockWidget = qobject_cast<QDockWidget *>(widget)) {
            dbg << "widgetItem(" << dockWidget << ")";
        } else if (auto *groupWindow = qobject_cast<QDockWidgetGroupWindow *>(widget)) {
            dbg << "widgetItem(" << groupWindow << "->(" << groupWindow->dockWidgets() << "))";
        } else {
            dbg << "widgetItem(" << widget << ")";
        }
    } else if (item.subinfo) {
        dbg << "subInfo(" << item.subinfo << "->(" << item.subinfo->item_list << ")";
    } else if (item.placeHolderItem) {
        dbg << "placeHolderItem(" << item.placeHolderItem << ")";
    }
    dbg << ")";
    return dbg;
}